

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal.hpp
# Opt level: O2

bool __thiscall CaDiCaL::Internal::frozen(Internal *this,int lit)

{
  pointer puVar1;
  ulong uVar2;
  
  uVar2 = (ulong)(uint)-lit;
  if (0 < lit) {
    uVar2 = (ulong)(uint)lit;
  }
  puVar1 = (this->frozentab).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
           .super__Vector_impl_data._M_start;
  if (uVar2 < (ulong)((long)(this->frozentab).
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_finish - (long)puVar1 >> 2)) {
    return puVar1[uVar2] != 0;
  }
  return false;
}

Assistant:

int vidx (int lit) const {
    int idx;
    assert (lit);
    assert (lit != INT_MIN);
    idx = abs (lit);
    assert (idx <= max_var);
    return idx;
  }